

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

ssize_t zisofs_extract_init(archive_write *a,zisofs_extract *zisofs,uchar *p,size_t bytes)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  void *pvVar4;
  ulong in_RCX;
  long *in_RDX;
  uint *in_RSI;
  archive *in_RDI;
  int err;
  size_t alloc;
  size_t xsize;
  size_t _ceil;
  size_t avail;
  size_t local_40;
  ulong local_30;
  long *local_20;
  
  uVar3 = (((*(long *)(in_RSI + 2) + (1L << ((byte)*in_RSI & 0x3f))) - 1U >> ((byte)*in_RSI & 0x3f))
          + 1) * 4;
  if (*(long *)(in_RSI + 8) == 0) {
    pvVar4 = malloc(((uVar3 >> 10) + 1) * 0x400);
    *(void **)(in_RSI + 8) = pvVar4;
    if (*(long *)(in_RSI + 8) == 0) {
      archive_set_error(in_RDI,0xc,"No memory for zisofs decompression");
      return -0x1e;
    }
  }
  *(ulong *)(in_RSI + 10) = uVar3;
  *(long *)(in_RSI + 4) = 1L << ((byte)*in_RSI & 0x3f);
  local_30 = in_RCX;
  local_20 = in_RDX;
  if (-1 < (char)((char)in_RSI[6] << 6)) {
    bVar1 = false;
    if (in_RCX < 0x10) {
      archive_set_error(in_RDI,0x54,"Illegal zisofs file body");
      return -0x1e;
    }
    if (*in_RDX == 0x7d6dbc99653e437) {
      uVar2 = archive_le32dec(in_RDX + 1);
      if ((ulong)uVar2 == *(ulong *)(in_RSI + 2)) {
        if ((*(char *)((long)in_RDX + 0xc) != '\x04') ||
           ((uint)*(byte *)((long)in_RDX + 0xd) != *in_RSI)) {
          bVar1 = true;
        }
      }
      else {
        bVar1 = true;
      }
    }
    else {
      bVar1 = true;
    }
    if (bVar1) {
      archive_set_error(in_RDI,0x54,"Illegal zisofs file body");
      return -0x1e;
    }
    local_30 = in_RCX - 0x10;
    local_20 = in_RDX + 2;
    *(byte *)(in_RSI + 6) = (byte)in_RSI[6] & 0xfd | 2;
  }
  if (((char)((char)in_RSI[6] << 6) < '\0') && (*(ulong *)(in_RSI + 0xc) < *(ulong *)(in_RSI + 10)))
  {
    local_40 = *(long *)(in_RSI + 10) - *(long *)(in_RSI + 0xc);
    if (local_30 < local_40) {
      local_40 = local_30;
    }
    memcpy((void *)(*(long *)(in_RSI + 8) + *(long *)(in_RSI + 0xc)),local_20,local_40);
    *(size_t *)(in_RSI + 0xc) = local_40 + *(long *)(in_RSI + 0xc);
    local_30 = local_30 - local_40;
    if (*(long *)(in_RSI + 0xc) == *(long *)(in_RSI + 10)) {
      in_RSI[0xe] = 0;
      in_RSI[0xf] = 0;
      in_RSI[0x10] = 0;
      *(byte *)(in_RSI + 6) = (byte)in_RSI[6] & 0xfe | 1;
    }
  }
  return local_30;
}

Assistant:

static ssize_t
zisofs_extract_init(struct archive_write *a, struct zisofs_extract *zisofs,
    const unsigned char *p, size_t bytes)
{
	size_t avail = bytes;
	size_t _ceil, xsize;

	/* Allocate block pointers buffer. */
	_ceil = (size_t)((zisofs->pz_uncompressed_size +
		(((int64_t)1) << zisofs->pz_log2_bs) - 1)
		>> zisofs->pz_log2_bs);
	xsize = (_ceil + 1) * 4;
	if (zisofs->block_pointers == NULL) {
		size_t alloc = ((xsize >> 10) + 1) << 10;
		zisofs->block_pointers = malloc(alloc);
		if (zisofs->block_pointers == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for zisofs decompression");
			return (ARCHIVE_FATAL);
		}
	}
	zisofs->block_pointers_size = xsize;

	/* Allocate uncompressed data buffer. */
	zisofs->uncompressed_buffer_size = (size_t)1UL << zisofs->pz_log2_bs;

	/*
	 * Read the file header, and check the magic code of zisofs.
	 */
	if (!zisofs->header_passed) {
		int err = 0;
		if (avail < 16) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs file body");
			return (ARCHIVE_FATAL);
		}

		if (memcmp(p, zisofs_magic, sizeof(zisofs_magic)) != 0)
			err = 1;
		else if (archive_le32dec(p + 8) != zisofs->pz_uncompressed_size)
			err = 1;
		else if (p[12] != 4 || p[13] != zisofs->pz_log2_bs)
			err = 1;
		if (err) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs file body");
			return (ARCHIVE_FATAL);
		}
		avail -= 16;
		p += 16;
		zisofs->header_passed = 1;
	}

	/*
	 * Read block pointers.
	 */
	if (zisofs->header_passed &&
	    zisofs->block_pointers_avail < zisofs->block_pointers_size) {
		xsize = zisofs->block_pointers_size
		    - zisofs->block_pointers_avail;
		if (avail < xsize)
			xsize = avail;
		memcpy(zisofs->block_pointers
		    + zisofs->block_pointers_avail, p, xsize);
		zisofs->block_pointers_avail += xsize;
		avail -= xsize;
	    	if (zisofs->block_pointers_avail
		    == zisofs->block_pointers_size) {
			/* We've got all block pointers and initialize
			 * related variables.	*/
			zisofs->block_off = 0;
			zisofs->block_avail = 0;
			/* Complete a initialization */
			zisofs->initialized = 1;
		}
	}
	return ((ssize_t)avail);
}